

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::selectPivots(CLUFactor<double> *this,double threshold)

{
  long lVar1;
  int iVar2;
  Pring *pPVar3;
  Pring *pPVar4;
  int *piVar5;
  int *piVar6;
  pointer pdVar7;
  pointer pdVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  Pring *pPVar12;
  int *piVar13;
  int *piVar14;
  pointer pdVar15;
  pointer pdVar16;
  int *piVar17;
  Pring *pPVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  Pring *pPVar23;
  Pring *pPVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  int local_dc;
  int local_d8;
  
  iVar21 = ~(this->temp).stage + this->thedim;
  iVar28 = 4;
  if (iVar21 < 4) {
    iVar28 = iVar21;
  }
  pPVar3 = (this->temp).pivot_rowNZ;
  pPVar4 = (this->temp).pivot_col;
  piVar5 = (this->u).row.start;
  piVar6 = (this->u).row.len;
  pdVar7 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar25 = this->thedim + 1;
  piVar9 = (this->u).col.start;
  piVar10 = (this->u).col.len;
  piVar11 = (this->temp).s_cact;
  pPVar12 = (this->temp).pivot_row;
  iVar34 = 0;
  dVar40 = 0.0;
  iVar31 = 2;
  iVar36 = -1;
  iVar21 = -1;
  local_d8 = -1;
  do {
    do {
      pPVar23 = (this->temp).pivot_colNZ + iVar31;
      for (pPVar24 = pPVar3 + iVar31; pPVar24 == pPVar24->next; pPVar24 = pPVar24 + 1) {
        if (pPVar23 != pPVar23->next) {
          iVar36 = pPVar23->next->idx;
          lVar39 = (long)iVar36;
          lVar38 = (long)(piVar9[lVar39] + -1 + piVar10[lVar39]);
          lVar33 = lVar38 - piVar11[lVar39];
          piVar13 = (this->u).col.idx;
          piVar14 = (this->u).row.len;
          pdVar15 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar16 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar17 = (this->u).row.start;
          local_dc = -1;
          iVar26 = iVar25;
          goto LAB_001a67b8;
        }
        iVar31 = iVar31 + 1;
        pPVar23 = pPVar23 + 1;
      }
      iVar21 = pPVar24->next->idx;
      iVar2 = piVar5[iVar21];
      iVar26 = piVar6[iVar21];
      dVar41 = pdVar7[iVar21];
      uVar32 = (ulong)(iVar26 + iVar2 + -1);
      if (dVar41 < 0.0) {
        dVar41 = ABS(pdVar8[uVar32]);
        for (lVar33 = (long)(iVar26 + iVar2 + -2); iVar2 <= lVar33; lVar33 = lVar33 + -1) {
          dVar42 = ABS(pdVar8[lVar33]);
          if (dVar42 <= dVar41) {
            dVar42 = dVar41;
          }
          dVar41 = dVar42;
        }
        pdVar7[iVar21] = dVar41;
      }
      uVar27 = 0xffffffff;
      iVar35 = iVar36;
      iVar22 = iVar25;
      for (; (long)iVar2 <= (long)uVar32; uVar32 = uVar32 - 1) {
        iVar36 = (this->u).row.idx[uVar32];
        lVar39 = (long)iVar36;
        iVar26 = (this->temp).s_cact[lVar39];
        dVar40 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32];
        if ((iVar26 < iVar22) && (dVar41 * threshold < ABS(dVar40))) {
          local_dc = (int)uVar32;
          uVar27 = uVar32 & 0xffffffff;
          iVar35 = iVar36;
          iVar22 = iVar26;
          if (iVar26 <= iVar31) goto LAB_001a69af;
        }
      }
      local_dc = (int)uVar27;
      lVar39 = (long)iVar35;
      iVar36 = iVar35;
      iVar26 = iVar22;
LAB_001a69af:
      pPVar24 = pPVar4[lVar39].next;
      pPVar23 = pPVar4[lVar39].prev;
      pPVar24->prev = pPVar23;
      pPVar23->next = pPVar24;
      pPVar4[lVar39].next = pPVar4 + lVar39;
      pPVar4[lVar39].prev = pPVar4 + lVar39;
    } while (local_dc < 0);
    pPVar12[iVar21].pos = local_dc - piVar5[iVar21];
    iVar26 = (iVar31 + -1) * (iVar26 + -1);
    pPVar12[iVar21].mkwtz = iVar26;
    pPVar24 = &(this->temp).pivots;
    do {
      pPVar24 = pPVar24->next;
      if ((pPVar24->idx < 0) || (pPVar24->idx == iVar21)) break;
    } while (pPVar24->mkwtz < iVar26);
    pPVar24 = pPVar24->prev;
    if (pPVar24->idx != iVar21) {
      pPVar23 = pPVar12[iVar21].next;
      pPVar18 = pPVar12[iVar21].prev;
      pPVar23->prev = pPVar18;
      pPVar18->next = pPVar23;
      pPVar23 = pPVar24->next;
      pPVar12[iVar21].next = pPVar23;
      pPVar23->prev = pPVar12 + iVar21;
      pPVar12[iVar21].prev = pPVar24;
      pPVar24->next = pPVar12 + iVar21;
    }
    iVar34 = iVar34 + 1;
    if (iVar28 <= iVar34) {
      return;
    }
  } while( true );
LAB_001a67b8:
  if (lVar38 <= lVar33) goto LAB_001a69af;
  iVar2 = piVar13[lVar38];
  iVar35 = piVar14[iVar2];
  if (iVar35 < iVar26) {
    dVar41 = pdVar15[iVar2];
    iVar22 = piVar17[iVar2];
    lVar37 = (long)iVar22;
    if (dVar41 <= 0.0) {
      iVar29 = iVar35 + iVar22;
      lVar30 = (long)iVar29;
      dVar41 = ABS(pdVar16[lVar37]);
      if (iVar22 < iVar29) {
        iVar29 = iVar22;
      }
      do {
        if (lVar30 <= lVar37) goto LAB_001a6899;
        lVar1 = lVar30 + -1;
        lVar19 = lVar30 + -1;
        dVar42 = ABS(pdVar16[lVar19]);
        if (dVar42 <= dVar41) {
          dVar42 = dVar41;
        }
        lVar20 = lVar30 + -1;
        lVar30 = lVar1;
        dVar41 = dVar42;
      } while ((this->u).row.idx[lVar20] != iVar36);
      local_d8 = (int)lVar1;
      iVar29 = local_d8 + 1;
      dVar40 = pdVar16[lVar19];
LAB_001a6899:
      for (lVar30 = (long)(iVar29 + -2); lVar37 < lVar30; lVar30 = lVar30 + -1) {
        dVar42 = ABS(pdVar16[lVar30]);
        if (ABS(pdVar16[lVar30]) <= dVar41) {
          dVar42 = dVar41;
        }
        dVar41 = dVar42;
      }
      pdVar15[iVar2] = dVar41;
    }
    else {
      lVar30 = (long)(iVar35 + iVar22);
      do {
        if (lVar30 <= lVar37) goto LAB_001a68cf;
        lVar1 = lVar30 + -1;
        lVar19 = lVar30 + -1;
        lVar30 = lVar1;
      } while ((this->u).row.idx[lVar19] != iVar36);
      dVar40 = pdVar16[lVar1];
      local_d8 = (int)lVar1;
    }
LAB_001a68cf:
    if ((dVar41 * threshold < ABS(dVar40)) &&
       (iVar21 = iVar2, iVar26 = iVar35, local_dc = local_d8, iVar35 <= iVar31 + 1))
    goto LAB_001a69af;
  }
  lVar38 = lVar38 + -1;
  goto LAB_001a67b8;
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}